

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

int If_ManCountSpecialPos(If_Man_t *p)

{
  uint *puVar1;
  byte *pbVar2;
  int iVar3;
  If_Par_t *pIVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  pIVar4 = p->pPars;
  iVar7 = pIVar4->nLatchesCo;
  uVar5 = pIVar4->nLatchesCoBox;
  uVar9 = (ulong)uVar5;
  iVar6 = p->nObjs[3];
  iVar8 = iVar6 - iVar7;
  if ((int)uVar5 < iVar8) {
    do {
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar9)) goto LAB_00440306;
      puVar1 = *(uint **)((long)p->vCos->pArray[uVar9] + 0x18);
      *puVar1 = *puVar1 & 0xfffffeff;
      uVar9 = uVar9 + 1;
      iVar6 = p->nObjs[3];
      pIVar4 = p->pPars;
      iVar7 = pIVar4->nLatchesCo;
      iVar8 = iVar6 - iVar7;
    } while ((int)uVar9 < iVar8);
    uVar9 = (ulong)(uint)pIVar4->nLatchesCoBox;
  }
  uVar5 = (uint)uVar9;
  if ((int)uVar5 < iVar8) {
    do {
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar9)) goto LAB_00440306;
      pbVar2 = (byte *)p->vCos->pArray[uVar9];
      if ((*pbVar2 & 0x10) == 0) {
        puVar1 = *(uint **)(pbVar2 + 0x18);
        *puVar1 = *puVar1 | 0x100;
        iVar6 = p->nObjs[3];
        pIVar4 = p->pPars;
      }
      uVar9 = uVar9 + 1;
      iVar7 = pIVar4->nLatchesCo;
      iVar8 = iVar6 - iVar7;
    } while ((int)uVar9 < iVar8);
    uVar5 = pIVar4->nLatchesCoBox;
  }
  iVar3 = 0;
  if ((int)uVar5 < iVar8) {
    uVar9 = (ulong)uVar5;
    iVar3 = 0;
    do {
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar9)) goto LAB_00440306;
      pbVar2 = (byte *)p->vCos->pArray[uVar9];
      if ((*pbVar2 & 0x10) != 0) {
        iVar3 = iVar3 + (uint)((**(uint **)(pbVar2 + 0x18) >> 8 & 1) != 0);
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < iVar8);
  }
  if ((int)uVar5 < iVar6 - iVar7) {
    uVar9 = (ulong)uVar5;
    do {
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar9)) {
LAB_00440306:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = *(uint **)((long)p->vCos->pArray[uVar9] + 0x18);
      *puVar1 = *puVar1 & 0xfffffeff;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < p->nObjs[3] - p->pPars->nLatchesCo);
  }
  return iVar3;
}

Assistant:

int If_ManCountSpecialPos( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( !If_ObjFaninC0(pObj) )
            If_ObjFanin0(pObj)->fMark = 1;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( If_ObjFaninC0(pObj) )
            Counter += If_ObjFanin0(pObj)->fMark;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    return Counter;
}